

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

void glucose_print_stats(SimpSolver *s,abctime clk)

{
  double dVar1;
  double dVar2;
  uint local_30;
  double mem_used;
  double cpu_time;
  abctime clk_local;
  SimpSolver *s_local;
  
  dVar1 = (double)(clk & 0xffffffff) / 1000000.0;
  dVar2 = Gluco::memUsed();
  if ((s->super_Solver).starts < 1) {
    local_30 = 0;
  }
  else {
    local_30 = (uint)((s->super_Solver).conflicts / (s->super_Solver).starts);
  }
  printf("c restarts              : %d (%d conflicts on average)\n",
         (s->super_Solver).starts & 0xffffffff,(ulong)local_30);
  printf("c blocked restarts      : %d (multiple: %d) \n",
         (s->super_Solver).nbstopsrestarts & 0xffffffff,
         (s->super_Solver).nbstopsrestartssame & 0xffffffff);
  printf("c last block at restart : %d\n",(s->super_Solver).lastblockatrestart & 0xffffffff);
  printf("c nb ReduceDB           : %-12d\n",(s->super_Solver).nbReduceDB & 0xffffffff);
  printf("c nb removed Clauses    : %-12d\n",(s->super_Solver).nbRemovedClauses & 0xffffffff);
  printf("c nb learnts DL2        : %-12d\n",(s->super_Solver).nbDL2 & 0xffffffff);
  printf("c nb learnts size 2     : %-12d\n",(s->super_Solver).nbBin & 0xffffffff);
  printf("c nb learnts size 1     : %-12d\n",(s->super_Solver).nbUn & 0xffffffff);
  printf("c conflicts             : %-12d  (%.0f /sec)\n",
         (double)(s->super_Solver).conflicts / dVar1,(s->super_Solver).conflicts & 0xffffffff);
  printf("c decisions             : %-12d  (%4.2f %% random) (%.0f /sec)\n",
         (double)(((float)(s->super_Solver).rnd_decisions * 100.0) /
                 (float)(s->super_Solver).decisions),(double)(s->super_Solver).decisions / dVar1,
         (s->super_Solver).decisions & 0xffffffff);
  printf("c propagations          : %-12d  (%.0f /sec)\n",
         (double)(s->super_Solver).propagations / dVar1,(s->super_Solver).propagations & 0xffffffff)
  ;
  printf("c conflict literals     : %-12d  (%4.2f %% deleted)\n",
         (double)(((s->super_Solver).max_literals - (s->super_Solver).tot_literals) * 100) /
         (double)(s->super_Solver).max_literals,(s->super_Solver).tot_literals & 0xffffffff);
  printf("c nb reduced Clauses    : %-12d\n",(s->super_Solver).nbReducedClauses & 0xffffffff);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    printf("Memory used           : %.2f MB\n",dVar2);
  }
  return;
}

Assistant:

void glucose_print_stats(SimpSolver& s, abctime clk)
{
    double cpu_time = (double)(unsigned)clk / CLOCKS_PER_SEC;
    double mem_used = memUsed();
    printf("c restarts              : %d (%d conflicts on average)\n",         (int)s.starts, s.starts > 0 ? (int)(s.conflicts/s.starts) : 0);
    printf("c blocked restarts      : %d (multiple: %d) \n",                   (int)s.nbstopsrestarts, (int)s.nbstopsrestartssame);
    printf("c last block at restart : %d\n",                                   (int)s.lastblockatrestart);
    printf("c nb ReduceDB           : %-12d\n",                                (int)s.nbReduceDB);
    printf("c nb removed Clauses    : %-12d\n",                                (int)s.nbRemovedClauses);
    printf("c nb learnts DL2        : %-12d\n",                                (int)s.nbDL2);
    printf("c nb learnts size 2     : %-12d\n",                                (int)s.nbBin);
    printf("c nb learnts size 1     : %-12d\n",                                (int)s.nbUn);
    printf("c conflicts             : %-12d  (%.0f /sec)\n",                   (int)s.conflicts,    s.conflicts   /cpu_time);
    printf("c decisions             : %-12d  (%4.2f %% random) (%.0f /sec)\n", (int)s.decisions,    (float)s.rnd_decisions*100 / (float)s.decisions, s.decisions   /cpu_time);
    printf("c propagations          : %-12d  (%.0f /sec)\n",                   (int)s.propagations, s.propagations/cpu_time);
    printf("c conflict literals     : %-12d  (%4.2f %% deleted)\n",            (int)s.tot_literals, (s.max_literals - s.tot_literals)*100 / (double)s.max_literals);
    printf("c nb reduced Clauses    : %-12d\n", (int)s.nbReducedClauses);
    if (mem_used != 0) printf("Memory used           : %.2f MB\n", mem_used);
    //printf("c CPU time              : %.2f sec\n", cpu_time);
}